

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce-operations.hpp
# Opt level: O0

void diy::all_to_all<void(*)(void*,diy::ReduceProxy_const&)>
               (Master *master,Assigner *assigner,_func_void_void_ptr_ReduceProxy_ptr **op,int k)

{
  int iVar1;
  Profiler *this;
  size_t rounds_;
  Assigner *in_RSI;
  long in_RDI;
  RegularSwapPartners partners;
  RegularDecomposer<diy::Bounds<int>_> decomposer;
  Scoped scoped;
  RegularDecomposer<diy::Bounds<int>_> *decomposer_00;
  RegularDecomposer<diy::Bounds<int>_> *this_00;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc50;
  ScopedProfile<diy::stats::Profiler> *this_01;
  allocator<char> *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  Neighbors *op_;
  string *in_stack_fffffffffffffc90;
  AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)> *this_02;
  BoolVector *share_face_;
  int in_stack_fffffffffffffcac;
  Bounds *in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcbc;
  RegularDecomposer<diy::Bounds<int>_> *in_stack_fffffffffffffcc0;
  CoordinateVector *in_stack_fffffffffffffcd0;
  DivisionsVector *in_stack_fffffffffffffcd8;
  undefined1 local_2b8 [16];
  pointer local_2a8;
  undefined1 local_298 [16];
  pointer local_288;
  AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)> local_278;
  undefined8 uStack_230;
  _Bit_type *local_228;
  SkipIntermediate *in_stack_ffffffffffffff00;
  AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)> *in_stack_ffffffffffffff08;
  RegularSwapPartners *in_stack_ffffffffffffff10;
  Assigner *in_stack_ffffffffffffff18;
  Master *in_stack_ffffffffffffff20;
  undefined1 local_71 [97];
  Assigner *local_10;
  
  this = (Profiler *)(in_RDI + 0x230);
  share_face_ = (BoolVector *)local_71;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),in_stack_fffffffffffffc78
             ,in_stack_fffffffffffffc70);
  stats::Profiler::scoped(this,in_stack_fffffffffffffc90);
  std::__cxx11::string::~string((string *)(local_71 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_71);
  Assigner::nblocks(local_10);
  interval((int)((ulong)in_stack_fffffffffffffc78 >> 0x20),(int)in_stack_fffffffffffffc78);
  iVar1 = Assigner::nblocks(local_10);
  this_01 = (ScopedProfile<diy::stats::Profiler> *)0x0;
  local_278.empty_link.neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_230._0_4_ = (type)0x0;
  uStack_230._4_4_ = (type)0x0;
  local_278.empty_link.neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.empty_link.neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228 = (_Bit_type *)0x0;
  op_ = &local_278.empty_link.neighbors_;
  Catch::clara::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)0x196d25);
  local_278.all_neighbors_link.neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_278.op = (_func_void_void_ptr_ReduceProxy_ptr **)0x0;
  local_278.all_neighbors_link.neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_02 = &local_278;
  local_278.all_neighbors_link.super_Factory<diy::Link>._vptr_Factory = (_func_int **)this_01;
  local_278.all_neighbors_link.neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)this_01;
  Catch::clara::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)0x196d58);
  local_298._0_8_ = 0;
  local_288 = (pointer)0x0;
  decomposer_00 = (RegularDecomposer<diy::Bounds<int>_> *)local_298;
  local_298._8_8_ = this_01;
  Catch::clara::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)0x196d83);
  local_2b8._0_8_ = 0;
  local_2a8 = (pointer)0x0;
  this_00 = (RegularDecomposer<diy::Bounds<int>_> *)local_2b8;
  local_2b8._8_8_ = this_01;
  Catch::clara::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)0x196dae);
  RegularDecomposer<diy::Bounds<int>_>::RegularDecomposer
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb0,
             in_stack_fffffffffffffcac,share_face_,(BoolVector *)this,in_stack_fffffffffffffcd0,
             in_stack_fffffffffffffcd8);
  Catch::clara::std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffc50);
  Catch::clara::std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffc50);
  Catch::clara::std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)0x196e13);
  Catch::clara::std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)0x196e20);
  Bounds<int>::~Bounds((Bounds<int> *)this_00);
  RegularSwapPartners::RegularSwapPartners<diy::RegularDecomposer<diy::Bounds<int>>>
            ((RegularSwapPartners *)this_00,decomposer_00,0,false);
  detail::AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)>::AllToAllReduce
            (this_02,(_func_void_void_ptr_ReduceProxy_ptr **)op_,
             (Assigner *)CONCAT44(iVar1,in_stack_fffffffffffffc80));
  rounds_ = RegularPartners::rounds((RegularPartners *)0x196e88);
  detail::SkipIntermediate::SkipIntermediate((SkipIntermediate *)&stack0xfffffffffffffca8,rounds_);
  reduce<diy::detail::AllToAllReduce<void(*)(void*,diy::ReduceProxy_const&)>,diy::RegularSwapPartners,diy::detail::SkipIntermediate>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  detail::AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)>::~AllToAllReduce
            ((AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)> *)this_00);
  RegularSwapPartners::~RegularSwapPartners((RegularSwapPartners *)0x196ed1);
  RegularDecomposer<diy::Bounds<int>_>::~RegularDecomposer(this_00);
  stats::ScopedProfile<diy::stats::Profiler>::~ScopedProfile(this_01);
  return;
}

Assistant:

void
all_to_all(Master&              master,     //!< block owner
           const Assigner&      assigner,   //!< global block locator (maps gid to proc)
           const Op&            op,         //!< user-defined operation called to enqueue and dequeue items
           int                  k = 2       //!< reduction fanout
          )
{
  auto scoped = master.prof.scoped("all_to_all");
  (void)scoped;
  RegularDecomposer<DiscreteBounds> decomposer(1, interval(0,assigner.nblocks()-1), assigner.nblocks());
  RegularSwapPartners  partners(decomposer, k, false);
  reduce(master, assigner, partners, detail::AllToAllReduce<Op>(op, assigner), detail::SkipIntermediate(partners.rounds()));
}